

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O3

void __thiscall HRSS_Golden_Test::TestBody(HRSS_Golden_Test *this)

{
  char cVar1;
  uint8_t uVar2;
  int iVar3;
  long lVar4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar5;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  int iVar15;
  long lVar16;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uint8_t shared_key [32];
  uint8_t generate_key_entropy [1432];
  uint8_t encap_entropy [1400];
  uint8_t ciphertext [1138];
  uint8_t pub_bytes [1138];
  HRSS_public_key pub;
  HRSS_private_key priv;
  undefined1 local_2140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2138;
  Bytes local_2130;
  AssertHelper local_2120;
  undefined1 local_2118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2108;
  Bytes local_20f8 [2];
  uint8_t local_20d8 [1440];
  undefined1 local_1b38 [8];
  undefined8 local_1b30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b28 [87];
  Bytes local_15b8 [3];
  byte local_1586;
  internal local_1138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1130 [142];
  HRSS_public_key local_cc0;
  HRSS_private_key local_730;
  
  lVar4 = 0;
  auVar18 = _DAT_00552ac0;
  auVar17 = _DAT_00552ad0;
  auVar35 = _DAT_00552ae0;
  auVar52 = _DAT_00552af0;
  auVar60 = _DAT_00552b00;
  auVar62 = _DAT_00552b10;
  auVar64 = _DAT_00552b20;
  auVar66 = _DAT_00539e60;
  do {
    auVar68 = auVar66 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar78._4_4_ = iVar3;
    auVar78._0_4_ = iVar3;
    auVar78._8_4_ = iVar15;
    auVar78._12_4_ = iVar15;
    auVar87._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar87._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar87._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar87._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar69._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar69._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar69._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar69._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar69 = auVar69 & auVar87;
    auVar68 = pshuflw(auVar78,auVar69,0xe8);
    auVar68 = packssdw(auVar68,auVar68);
    uVar2 = (uint8_t)lVar4;
    if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20d8[lVar4] = uVar2;
    }
    auVar68 = packssdw(auVar69,auVar69);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._0_4_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 1] = uVar2 + '\x01';
    }
    auVar68 = auVar64 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar79._4_4_ = iVar3;
    auVar79._0_4_ = iVar3;
    auVar79._8_4_ = iVar15;
    auVar79._12_4_ = iVar15;
    auVar88._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar88._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar88._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar88._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar70._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar70._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar70._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar70._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar70 = auVar70 & auVar88;
    auVar68 = packssdw(auVar79,auVar70);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._0_4_ >> 0x10 & 1) != 0) {
      local_20d8[lVar4 + 2] = uVar2 + '\x02';
    }
    auVar68 = pshufhw(auVar70,auVar70,0x84);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._0_4_ >> 0x18 & 1) != 0) {
      local_20d8[lVar4 + 3] = uVar2 + '\x03';
    }
    auVar68 = auVar62 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar80._4_4_ = iVar3;
    auVar80._0_4_ = iVar3;
    auVar80._8_4_ = iVar15;
    auVar80._12_4_ = iVar15;
    auVar89._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar89._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar89._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar89._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar71._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar71._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar71._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar71._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar71 = auVar71 & auVar89;
    auVar68 = pshuflw(auVar80,auVar71,0xe8);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 4] = uVar2 + '\x04';
    }
    auVar68 = packssdw(auVar71,auVar71);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._4_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 5] = uVar2 + '\x05';
    }
    auVar68 = auVar60 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar81._4_4_ = iVar3;
    auVar81._0_4_ = iVar3;
    auVar81._8_4_ = iVar15;
    auVar81._12_4_ = iVar15;
    auVar90._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar90._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar90._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar90._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar72._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar72._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar72._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar72._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar72 = auVar72 & auVar90;
    auVar68 = packssdw(auVar81,auVar72);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 6] = uVar2 + '\x06';
    }
    auVar68 = pshufhw(auVar72,auVar72,0x84);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._6_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 7] = uVar2 + '\a';
    }
    auVar68 = auVar52 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar82._4_4_ = iVar3;
    auVar82._0_4_ = iVar3;
    auVar82._8_4_ = iVar15;
    auVar82._12_4_ = iVar15;
    auVar91._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar91._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar91._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar91._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar73._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar73._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar73._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar73._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar73 = auVar73 & auVar91;
    auVar68 = pshuflw(auVar82,auVar73,0xe8);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 8] = uVar2 + '\b';
    }
    auVar68 = packssdw(auVar73,auVar73);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._8_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 9] = uVar2 + '\t';
    }
    auVar68 = auVar35 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar83._4_4_ = iVar3;
    auVar83._0_4_ = iVar3;
    auVar83._8_4_ = iVar15;
    auVar83._12_4_ = iVar15;
    auVar92._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar92._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar92._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar92._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar74._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar74._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar74._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar74._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar74 = auVar74 & auVar92;
    auVar68 = packssdw(auVar83,auVar74);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 10] = uVar2 + '\n';
    }
    auVar68 = pshufhw(auVar74,auVar74,0x84);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._10_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0xb] = uVar2 + '\v';
    }
    auVar68 = auVar17 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar84._4_4_ = iVar3;
    auVar84._0_4_ = iVar3;
    auVar84._8_4_ = iVar15;
    auVar84._12_4_ = iVar15;
    auVar93._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar93._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar93._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar93._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar75._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar75._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar75._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar75._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar75 = auVar75 & auVar93;
    auVar68 = pshuflw(auVar84,auVar75,0xe8);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0xc] = uVar2 + '\f';
    }
    auVar68 = packssdw(auVar75,auVar75);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._12_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0xd] = uVar2 + '\r';
    }
    auVar68 = auVar18 ^ _DAT_00539e70;
    iVar3 = auVar68._0_4_;
    iVar15 = auVar68._8_4_;
    auVar85._4_4_ = iVar3;
    auVar85._0_4_ = iVar3;
    auVar85._8_4_ = iVar15;
    auVar85._12_4_ = iVar15;
    auVar94._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar94._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar94._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar94._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar76._0_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar76._4_4_ = -(uint)(auVar68._4_4_ == -0x80000000);
    auVar76._8_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar76._12_4_ = -(uint)(auVar68._12_4_ == -0x80000000);
    auVar76 = auVar76 & auVar94;
    auVar68 = packssdw(auVar85,auVar76);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0xe] = uVar2 + '\x0e';
    }
    auVar68 = pshufhw(auVar76,auVar76,0x84);
    auVar68 = packssdw(auVar68,auVar68);
    auVar68 = packsswb(auVar68,auVar68);
    if ((auVar68._14_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0xf] = uVar2 + '\x0f';
    }
    lVar4 = lVar4 + 0x10;
    lVar16 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar16 + 0x10;
    lVar16 = auVar64._8_8_;
    auVar64._0_8_ = auVar64._0_8_ + 0x10;
    auVar64._8_8_ = lVar16 + 0x10;
    lVar16 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 0x10;
    auVar62._8_8_ = lVar16 + 0x10;
    lVar16 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + 0x10;
    auVar60._8_8_ = lVar16 + 0x10;
    lVar16 = auVar52._8_8_;
    auVar52._0_8_ = auVar52._0_8_ + 0x10;
    auVar52._8_8_ = lVar16 + 0x10;
    lVar16 = auVar35._8_8_;
    auVar35._0_8_ = auVar35._0_8_ + 0x10;
    auVar35._8_8_ = lVar16 + 0x10;
    lVar16 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 0x10;
    auVar17._8_8_ = lVar16 + 0x10;
    lVar16 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 0x10;
    auVar18._8_8_ = lVar16 + 0x10;
  } while (lVar4 != 0x2c0);
  lVar4 = 0;
  do {
    auVar68._8_4_ = (int)lVar4;
    auVar68._0_8_ = lVar4;
    auVar68._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar18 = (auVar68 | _DAT_00539e60) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar36._4_4_ = iVar3;
    auVar36._0_4_ = iVar3;
    auVar36._8_4_ = iVar15;
    auVar36._12_4_ = iVar15;
    auVar53._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar53._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar53._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar53._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar19._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar53;
    auVar18 = pshuflw(auVar36,auVar19,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    cVar1 = (char)lVar4;
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 700] = cVar1 + 0xbe;
    }
    auVar18 = packssdw(auVar19,auVar19);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._0_4_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2bd] = cVar1 + 0xbf;
    }
    auVar18 = (auVar68 | _DAT_00552b20) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar37._4_4_ = iVar3;
    auVar37._0_4_ = iVar3;
    auVar37._8_4_ = iVar15;
    auVar37._12_4_ = iVar15;
    auVar54._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar54._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar54._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar54._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar20._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar54;
    auVar18 = packssdw(auVar37,auVar20);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
      local_20d8[lVar4 + 0x2be] = cVar1 + 0xc0;
    }
    auVar18 = pshufhw(auVar20,auVar20,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._0_4_ >> 0x18 & 1) != 0) {
      local_20d8[lVar4 + 0x2bf] = cVar1 + 0xc1;
    }
    auVar18 = (auVar68 | _DAT_00552b10) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar38._4_4_ = iVar3;
    auVar38._0_4_ = iVar3;
    auVar38._8_4_ = iVar15;
    auVar38._12_4_ = iVar15;
    auVar55._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar55._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar55._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar55._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar21._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar55;
    auVar18 = pshuflw(auVar38,auVar21,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0x2c0] = cVar1 + 0xc2;
    }
    auVar18 = packssdw(auVar21,auVar21);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._4_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2c1] = cVar1 + 0xc3;
    }
    auVar18 = (auVar68 | _DAT_00552b00) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar39._4_4_ = iVar3;
    auVar39._0_4_ = iVar3;
    auVar39._8_4_ = iVar15;
    auVar39._12_4_ = iVar15;
    auVar56._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar56._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar56._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar56._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar22._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar56;
    auVar18 = packssdw(auVar39,auVar22);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0x2c2] = cVar1 + 0xc4;
    }
    auVar18 = pshufhw(auVar22,auVar22,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._6_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2c3] = cVar1 + 0xc5;
    }
    auVar18 = (auVar68 | _DAT_00552af0) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar40._4_4_ = iVar3;
    auVar40._0_4_ = iVar3;
    auVar40._8_4_ = iVar15;
    auVar40._12_4_ = iVar15;
    auVar57._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar57._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar57._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar57._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar23._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar57;
    auVar18 = pshuflw(auVar40,auVar23,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0x2c4] = cVar1 + 0xc6;
    }
    auVar18 = packssdw(auVar23,auVar23);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._8_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2c5] = cVar1 + 199;
    }
    auVar18 = (auVar68 | _DAT_00552ae0) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar41._4_4_ = iVar3;
    auVar41._0_4_ = iVar3;
    auVar41._8_4_ = iVar15;
    auVar41._12_4_ = iVar15;
    auVar58._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar58._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar58._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar58._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar24._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar58;
    auVar18 = packssdw(auVar41,auVar24);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0x2c6] = cVar1 + 200;
    }
    auVar18 = pshufhw(auVar24,auVar24,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._10_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2c7] = cVar1 + 0xc9;
    }
    auVar18 = (auVar68 | _DAT_00552ad0) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar42._4_4_ = iVar3;
    auVar42._0_4_ = iVar3;
    auVar42._8_4_ = iVar15;
    auVar42._12_4_ = iVar15;
    auVar59._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar59._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar59._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar59._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar25._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar59;
    auVar18 = pshuflw(auVar42,auVar25,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0x2c8] = cVar1 + 0xca;
    }
    auVar18 = packssdw(auVar25,auVar25);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._12_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2c9] = cVar1 + 0xcb;
    }
    auVar18 = (auVar68 | _DAT_00552ac0) ^ _DAT_00539e70;
    iVar3 = auVar18._0_4_;
    iVar15 = auVar18._8_4_;
    auVar26._4_4_ = iVar3;
    auVar26._0_4_ = iVar3;
    auVar26._8_4_ = iVar15;
    auVar26._12_4_ = iVar15;
    auVar43._0_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar43._4_4_ = -(uint)(iVar3 < -0x7ffffd44);
    auVar43._8_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar43._12_4_ = -(uint)(iVar15 < -0x7ffffd44);
    auVar6._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar6._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar6._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar6._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar6 = auVar6 & auVar43;
    auVar18 = packssdw(auVar26,auVar6);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0x2ca] = cVar1 + 0xcc;
    }
    auVar18 = pshufhw(auVar6,auVar6,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._14_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0x2cb] = cVar1 + 0xcd;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x2c0);
  local_20d8[0x578] = '|';
  local_20d8[0x579] = '}';
  local_20d8[0x57a] = '~';
  local_20d8[0x57b] = '\x7f';
  local_20d8[0x57c] = 0x80;
  local_20d8[0x57d] = 0x81;
  local_20d8[0x57e] = 0x82;
  local_20d8[0x57f] = 0x83;
  local_20d8[0x580] = 0x84;
  local_20d8[0x581] = 0x85;
  local_20d8[0x582] = 0x86;
  local_20d8[0x583] = 0x87;
  local_20d8[0x584] = 0x88;
  local_20d8[0x585] = 0x89;
  local_20d8[0x586] = 0x8a;
  local_20d8[0x587] = 0x8b;
  local_20d8[0x588] = 0x8c;
  local_20d8[0x589] = 0x8d;
  local_20d8[0x58a] = 0x8e;
  local_20d8[0x58b] = 0x8f;
  local_20d8[0x58c] = 0x90;
  local_20d8[0x58d] = 0x91;
  local_20d8[0x58e] = 0x92;
  local_20d8[0x58f] = 0x93;
  local_20d8[0x590] = 0x94;
  local_20d8[0x591] = 0x95;
  local_20d8[0x592] = 0x96;
  local_20d8[0x593] = 0x97;
  local_20d8[0x594] = 0x98;
  local_20d8[0x595] = 0x99;
  local_20d8[0x596] = 0x9a;
  local_20d8[0x597] = 0x9b;
  memset(&local_cc0,0,0x590);
  memset(&local_730,0,0x710);
  iVar3 = HRSS_generate_key(&local_cc0,&local_730,local_20d8);
  local_1138[0] = (internal)(iVar3 != 0);
  local_1130[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)local_15b8);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1130;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b38,local_1138,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_20f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0xf8,(char *)CONCAT71(local_1b38._1_7_,local_1b38[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_20f8,(Message *)local_15b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_20f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1b38._1_7_,local_1b38[0]) != local_1b28) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1b38._1_7_,local_1b38[0]),
                      local_1b28[0]._M_allocated_capacity + 1);
    }
    local_2110 = local_1130[0];
    if ((internal *)local_15b8[0].span_.data_ != (internal *)0x0) {
      (**(code **)(*(long *)local_15b8[0].span_.data_ + 8))();
      local_2110 = local_1130[0];
    }
  }
  else {
    HRSS_marshal_public_key((uint8_t *)local_1138,&local_cc0);
    local_15b8[0].span_.size_ = 0x472;
    local_20f8[0].span_.data_ = TestBody::kExpectedPub;
    local_20f8[0].span_.size_ = 0x472;
    local_15b8[0].span_.data_ = (uchar *)local_1138;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1b38,"Bytes(pub_bytes)","Bytes(kExpectedPub)",local_15b8,local_20f8
              );
    if (local_1b38[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_15b8);
      if (local_1b30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_1b30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_20f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x15d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_20f8,(Message *)local_15b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_20f8);
      if ((internal *)local_15b8[0].span_.data_ != (internal *)0x0) {
        (**(code **)(*(long *)local_15b8[0].span_.data_ + 8))();
      }
    }
    if (local_1b30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b30,local_1b30);
    }
    lVar4 = 0;
    auVar61 = _DAT_00552ac0;
    auVar63 = _DAT_00552ad0;
    auVar65 = _DAT_00552ae0;
    auVar67 = _DAT_00552af0;
    auVar77 = _DAT_00552b00;
    auVar86 = _DAT_00552b10;
    auVar95 = _DAT_00552b20;
    auVar96 = _DAT_00539e60;
    do {
      auVar18 = auVar96 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar27._4_4_ = iVar3;
      auVar27._0_4_ = iVar3;
      auVar27._8_4_ = iVar15;
      auVar27._12_4_ = iVar15;
      auVar44._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar44._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar44._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar44._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar7._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar7._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar7._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar7._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar7 = auVar7 & auVar44;
      auVar18 = pshuflw(auVar27,auVar7,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      cVar1 = (char)lVar4;
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_1b38[lVar4] = cVar1 + '\x1f';
      }
      auVar18 = packssdw(auVar7,auVar7);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._0_4_ >> 8 & 1) != 0) {
        local_1b38[lVar4 + 1] = cVar1 + ' ';
      }
      auVar18 = auVar95 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar28._4_4_ = iVar3;
      auVar28._0_4_ = iVar3;
      auVar28._8_4_ = iVar15;
      auVar28._12_4_ = iVar15;
      auVar45._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar45._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar45._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar45._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar8._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar8._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar8._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar8._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar8 = auVar8 & auVar45;
      auVar18 = packssdw(auVar28,auVar8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
        local_1b38[lVar4 + 2] = cVar1 + '!';
      }
      auVar18 = pshufhw(auVar8,auVar8,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._0_4_ >> 0x18 & 1) != 0) {
        local_1b38[lVar4 + 3] = cVar1 + '\"';
      }
      auVar18 = auVar86 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar29._4_4_ = iVar3;
      auVar29._0_4_ = iVar3;
      auVar29._8_4_ = iVar15;
      auVar29._12_4_ = iVar15;
      auVar46._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar46._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar46._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar46._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar9._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar9._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar9._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar9._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar9 = auVar9 & auVar46;
      auVar18 = pshuflw(auVar29,auVar9,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_1b38[lVar4 + 4] = cVar1 + '#';
      }
      auVar18 = packssdw(auVar9,auVar9);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._4_2_ >> 8 & 1) != 0) {
        local_1b38[lVar4 + 5] = cVar1 + '$';
      }
      auVar18 = auVar77 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar30._4_4_ = iVar3;
      auVar30._0_4_ = iVar3;
      auVar30._8_4_ = iVar15;
      auVar30._12_4_ = iVar15;
      auVar47._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar47._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar47._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar47._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar10._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar10._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar10._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar10._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar10 = auVar10 & auVar47;
      auVar18 = packssdw(auVar30,auVar10);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_1b38[lVar4 + 6] = cVar1 + '%';
      }
      auVar18 = pshufhw(auVar10,auVar10,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._6_2_ >> 8 & 1) != 0) {
        local_1b38[lVar4 + 7] = cVar1 + '&';
      }
      auVar18 = auVar67 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar31._4_4_ = iVar3;
      auVar31._0_4_ = iVar3;
      auVar31._8_4_ = iVar15;
      auVar31._12_4_ = iVar15;
      auVar48._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar48._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar48._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar48._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar11._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar11._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar11._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar11._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar11 = auVar11 & auVar48;
      auVar18 = pshuflw(auVar31,auVar11,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_1b28[0]._M_local_buf[lVar4 + -8] = cVar1 + '\'';
      }
      auVar18 = packssdw(auVar11,auVar11);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._8_2_ >> 8 & 1) != 0) {
        local_1b28[0]._M_local_buf[lVar4 + -7] = cVar1 + '(';
      }
      auVar18 = auVar65 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar32._4_4_ = iVar3;
      auVar32._0_4_ = iVar3;
      auVar32._8_4_ = iVar15;
      auVar32._12_4_ = iVar15;
      auVar49._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar49._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar49._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar49._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar12._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar12._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar12._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar12._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar12 = auVar12 & auVar49;
      auVar18 = packssdw(auVar32,auVar12);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_1b28[0]._M_local_buf[lVar4 + -6] = cVar1 + ')';
      }
      auVar18 = pshufhw(auVar12,auVar12,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._10_2_ >> 8 & 1) != 0) {
        local_1b28[0]._M_local_buf[lVar4 + -5] = cVar1 + '*';
      }
      auVar18 = auVar63 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar33._4_4_ = iVar3;
      auVar33._0_4_ = iVar3;
      auVar33._8_4_ = iVar15;
      auVar33._12_4_ = iVar15;
      auVar50._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar50._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar50._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar50._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar13._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar13._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar13._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar13._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar13 = auVar13 & auVar50;
      auVar18 = pshuflw(auVar33,auVar13,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_1b28[0]._M_local_buf[lVar4 + -4] = cVar1 + '+';
      }
      auVar18 = packssdw(auVar13,auVar13);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._12_2_ >> 8 & 1) != 0) {
        local_1b28[0]._M_local_buf[lVar4 + -3] = cVar1 + ',';
      }
      auVar18 = auVar61 ^ _DAT_00539e70;
      iVar3 = auVar18._0_4_;
      iVar15 = auVar18._8_4_;
      auVar34._4_4_ = iVar3;
      auVar34._0_4_ = iVar3;
      auVar34._8_4_ = iVar15;
      auVar34._12_4_ = iVar15;
      auVar51._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar51._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar51._8_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar51._12_4_ = -(uint)(iVar15 < -0x7ffffa88);
      auVar14._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar14._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar14._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar14._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar14 = auVar14 & auVar51;
      auVar18 = packssdw(auVar34,auVar14);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_1b28[0]._M_local_buf[lVar4 + -2] = cVar1 + '-';
      }
      auVar18 = pshufhw(auVar14,auVar14,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._14_2_ >> 8 & 1) != 0) {
        local_1b28[0]._M_local_buf[lVar4 + -1] = cVar1 + '.';
      }
      lVar4 = lVar4 + 0x10;
      lVar16 = auVar96._8_8_;
      auVar96._0_8_ = auVar96._0_8_ + 0x10;
      auVar96._8_8_ = lVar16 + 0x10;
      lVar16 = auVar95._8_8_;
      auVar95._0_8_ = auVar95._0_8_ + 0x10;
      auVar95._8_8_ = lVar16 + 0x10;
      lVar16 = auVar86._8_8_;
      auVar86._0_8_ = auVar86._0_8_ + 0x10;
      auVar86._8_8_ = lVar16 + 0x10;
      lVar16 = auVar77._8_8_;
      auVar77._0_8_ = auVar77._0_8_ + 0x10;
      auVar77._8_8_ = lVar16 + 0x10;
      lVar16 = auVar67._8_8_;
      auVar67._0_8_ = auVar67._0_8_ + 0x10;
      auVar67._8_8_ = lVar16 + 0x10;
      lVar16 = auVar65._8_8_;
      auVar65._0_8_ = auVar65._0_8_ + 0x10;
      auVar65._8_8_ = lVar16 + 0x10;
      lVar16 = auVar63._8_8_;
      auVar63._0_8_ = auVar63._0_8_ + 0x10;
      auVar63._8_8_ = lVar16 + 0x10;
      lVar16 = auVar61._8_8_;
      auVar61._0_8_ = auVar61._0_8_ + 0x10;
      auVar61._8_8_ = lVar16 + 0x10;
    } while (lVar4 != 0x580);
    iVar3 = HRSS_encap((uint8_t *)local_15b8,(uint8_t *)local_20f8,&local_cc0,local_1b38);
    local_2140[0] = iVar3 != 0;
    local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_2130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2118,(internal *)local_2140,
                 (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub, encap_entropy)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2120,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x165,(char *)CONCAT71(local_2118._1_7_,local_2118[0]));
      testing::internal::AssertHelper::operator=(&local_2120,(Message *)&local_2130);
    }
    else {
      local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x472;
      local_2130.span_.data_ = TestBody::kExpectedCiphertext;
      local_2130.span_.size_ = 0x472;
      local_2140 = (undefined1  [8])local_15b8;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_2118,"Bytes(ciphertext)","Bytes(kExpectedCiphertext)",
                 (Bytes *)local_2140,&local_2130);
      if (local_2118[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2140);
        if (local_2110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_2110->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0x1c8,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_2130,(Message *)local_2140);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2130);
        if (local_2140 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2140 + 8))();
        }
      }
      if (local_2110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2110,local_2110);
      }
      local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
      local_2130.span_.data_ = TestBody::kExpectedSharedKey;
      local_2130.span_.size_ = 0x20;
      local_2140 = (undefined1  [8])local_20f8;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_2118,"Bytes(shared_key)","Bytes(kExpectedSharedKey)",
                 (Bytes *)local_2140,&local_2130);
      if (local_2118[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_2140);
        if (local_2110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_2110->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0x1cf,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_2130,(Message *)local_2140);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2130);
        if (local_2140 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2140 + 8))();
        }
      }
      if (local_2110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2110,local_2110);
      }
      iVar3 = HRSS_decap((uint8_t *)local_20f8,&local_730,(uint8_t *)local_15b8,0x472);
      local_2140[0] = iVar3 != 0;
      local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_2130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_2118,(internal *)local_2140,
                   (AssertionResult *)
                   "HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0x1d1,(char *)CONCAT71(local_2118._1_7_,local_2118[0]));
        testing::internal::AssertHelper::operator=(&local_2120,(Message *)&local_2130);
      }
      else {
        local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
        local_2130.span_.data_ = TestBody::kExpectedSharedKey;
        local_2130.span_.size_ = 0x20;
        local_2140 = (undefined1  [8])local_20f8;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_2118,"Bytes(shared_key, sizeof(shared_key))",
                   "Bytes(kExpectedSharedKey, sizeof(kExpectedSharedKey))",(Bytes *)local_2140,
                   &local_2130);
        if (local_2118[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_2140);
          if (local_2110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_2110->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_2130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                     ,0x1d3,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_2130,(Message *)local_2140);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2130);
          if (local_2140 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_2140 + 8))();
          }
        }
        if (local_2110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2110,local_2110);
        }
        local_1586 = local_1586 ^ 4;
        iVar3 = HRSS_decap((uint8_t *)local_20f8,&local_730,(uint8_t *)local_15b8,0x472);
        local_2140[0] = iVar3 != 0;
        local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 != 0) {
          local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DAT_00000020;
          local_2130.span_.data_ = TestBody::kExpectedFailureKey;
          local_2130.span_.size_ = 0x20;
          local_2140 = (undefined1  [8])local_20f8;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_2118,"Bytes(shared_key)","Bytes(kExpectedFailureKey)",
                     (Bytes *)local_2140,&local_2130);
          if (local_2118[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_2140);
            if (local_2110 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = (local_2110->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_2130,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0x1de,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_2130,(Message *)local_2140);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2130);
            if (local_2140 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_2140 + 8))();
            }
          }
          if (local_2110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            return;
          }
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_2110;
          goto LAB_0030c3b8;
        }
        testing::Message::Message((Message *)&local_2130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_2118,(internal *)local_2140,
                   (AssertionResult *)
                   "HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0x1d7,(char *)CONCAT71(local_2118._1_7_,local_2118[0]));
        testing::internal::AssertHelper::operator=(&local_2120,(Message *)&local_2130);
      }
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2138;
    testing::internal::AssertHelper::~AssertHelper(&local_2120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2118._1_7_,local_2118[0]) != &local_2108) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2118._1_7_,local_2118[0]),
                      local_2108._M_allocated_capacity + 1);
    }
    local_2110 = local_2138;
    if ((long *)local_2130.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_2130.span_.data_ + 8))();
      local_2110 = local_2138;
    }
  }
  if (local_2110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
LAB_0030c3b8:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_2110);
  return;
}

Assistant:

TEST(HRSS, Golden) {
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  for (unsigned i = 0; i < HRSS_SAMPLE_BYTES; i++) {
    generate_key_entropy[i] = i;
  }
  for (unsigned i = HRSS_SAMPLE_BYTES; i < 2 * HRSS_SAMPLE_BYTES; i++) {
    generate_key_entropy[i] = 2 + i;
  }
  for (unsigned i = 2 * HRSS_SAMPLE_BYTES; i < sizeof(generate_key_entropy);
       i++) {
    generate_key_entropy[i] = 4 + i;
  }

  HRSS_public_key pub;
  HRSS_private_key priv;
  OPENSSL_memset(&pub, 0, sizeof(pub));
  OPENSSL_memset(&priv, 0, sizeof(priv));
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

  static const uint8_t kExpectedPub[HRSS_PUBLIC_KEY_BYTES] = {
      0x4a, 0x21, 0x39, 0x7c, 0xb4, 0xa6, 0x58, 0x15, 0x35, 0x77, 0xe4, 0x2a,
      0x02, 0x79, 0xc0, 0x02, 0xe2, 0x21, 0x27, 0x5f, 0x49, 0xc7, 0x2c, 0x14,
      0xb6, 0xe0, 0x67, 0xc2, 0xc7, 0x09, 0x62, 0x0c, 0xe5, 0x23, 0x9c, 0x40,
      0xd7, 0x7e, 0xf5, 0x55, 0x5a, 0xa2, 0xd0, 0x9f, 0xd3, 0x8c, 0x67, 0x7b,
      0x48, 0xa4, 0x53, 0x8d, 0x39, 0xb1, 0xcc, 0x99, 0x29, 0xf7, 0x83, 0xbf,
      0x6f, 0x9b, 0x16, 0x73, 0x23, 0xcc, 0xc3, 0x86, 0x98, 0xb1, 0x7c, 0x53,
      0xb1, 0xf5, 0xf4, 0xdd, 0xc8, 0x97, 0x5e, 0xd3, 0x6d, 0x63, 0xce, 0xf3,
      0xa2, 0xf6, 0xef, 0x94, 0xed, 0x4a, 0x3e, 0xe6, 0x4b, 0xa2, 0xfb, 0x87,
      0xa3, 0xbc, 0x65, 0x1c, 0x17, 0x64, 0x25, 0xa7, 0xb4, 0xa1, 0xe6, 0x84,
      0x06, 0x72, 0x0c, 0x28, 0xe8, 0xfc, 0xaa, 0xca, 0xf8, 0x20, 0x79, 0x89,
      0xa9, 0xf0, 0x60, 0xdf, 0xd6, 0xd4, 0xe0, 0xaf, 0x99, 0x54, 0x21, 0xaf,
      0x76, 0xd5, 0x9a, 0x31, 0x80, 0xea, 0x7f, 0x03, 0x6c, 0x14, 0x74, 0x06,
      0x9c, 0x93, 0xe3, 0x93, 0xcc, 0x46, 0x4d, 0x82, 0xda, 0xdf, 0x67, 0xe9,
      0x6d, 0x58, 0x2b, 0x49, 0xf3, 0x10, 0x71, 0xa0, 0xc5, 0xec, 0xa0, 0x29,
      0xd7, 0x7c, 0x43, 0xd5, 0x05, 0x7e, 0x14, 0x8c, 0x39, 0x28, 0xf9, 0x46,
      0x3d, 0xc1, 0x10, 0x6c, 0x2f, 0xaa, 0xca, 0x11, 0x87, 0x6a, 0xe2, 0xb1,
      0xf6, 0x31, 0x76, 0xb0, 0xdc, 0x30, 0x8a, 0x97, 0x7d, 0xdc, 0xe4, 0xd1,
      0x18, 0xe9, 0x03, 0x91, 0xf5, 0xd2, 0x94, 0x4d, 0x71, 0xf7, 0x35, 0xc8,
      0x3e, 0x46, 0xaf, 0xa3, 0xeb, 0x35, 0x07, 0x01, 0x77, 0xc5, 0x58, 0xca,
      0x82, 0x67, 0x3e, 0x4f, 0x01, 0x88, 0xa4, 0xa0, 0xea, 0x0a, 0xb7, 0x13,
      0x06, 0xbe, 0xb6, 0x61, 0xa4, 0xa2, 0x28, 0xe2, 0x32, 0xcf, 0x25, 0x46,
      0xcf, 0xce, 0xf5, 0x57, 0x9b, 0x74, 0x8f, 0xfd, 0xbc, 0xfa, 0x3a, 0xa2,
      0x18, 0x22, 0xf1, 0xb1, 0x43, 0x12, 0xe8, 0xe2, 0xe3, 0x06, 0xe6, 0x1c,
      0xa7, 0x76, 0x2d, 0x0d, 0xe5, 0x5f, 0xbd, 0x8f, 0xa0, 0x95, 0xcd, 0xe9,
      0x28, 0xdb, 0xcc, 0xe5, 0x66, 0x33, 0xd4, 0x4b, 0xf9, 0x0c, 0x42, 0x9b,
      0x27, 0xee, 0x11, 0xd0, 0xe3, 0x0b, 0x9d, 0xce, 0x2c, 0x91, 0x7a, 0x0e,
      0xb8, 0xde, 0x31, 0x73, 0x86, 0x8e, 0x34, 0x59, 0x93, 0x2e, 0x37, 0x9d,
      0xc2, 0x3e, 0x89, 0x0b, 0x47, 0xff, 0xa6, 0x55, 0x21, 0xe6, 0x4f, 0x72,
      0x7c, 0xcc, 0xe5, 0xb8, 0x18, 0x2c, 0x10, 0xcb, 0xce, 0x48, 0xa5, 0xc5,
      0x26, 0xb6, 0x19, 0x76, 0xc5, 0x38, 0xf0, 0x38, 0x72, 0xec, 0x22, 0xf9,
      0x25, 0xde, 0x1c, 0x0c, 0x1b, 0x3e, 0x43, 0xc5, 0x5c, 0x8c, 0xdb, 0xf1,
      0x42, 0x66, 0xbc, 0xdf, 0xa0, 0x82, 0x4b, 0xec, 0xe1, 0x50, 0x42, 0x57,
      0x84, 0x60, 0xfd, 0x89, 0x12, 0x1b, 0xf6, 0xf9, 0x4d, 0x0d, 0x16, 0xe8,
      0xa4, 0xe2, 0x67, 0x2c, 0x8f, 0x22, 0xea, 0xba, 0x46, 0x34, 0xce, 0x97,
      0x8b, 0x4c, 0x38, 0x0e, 0x16, 0x82, 0xb6, 0xf3, 0x34, 0x38, 0x07, 0x87,
      0x73, 0x2a, 0x3d, 0x80, 0x56, 0x4b, 0x85, 0x67, 0xca, 0x2a, 0x19, 0xb6,
      0xb6, 0x2c, 0xfe, 0xd8, 0x02, 0xe5, 0xad, 0xd0, 0x61, 0x79, 0x73, 0xab,
      0xda, 0x3b, 0xa4, 0x51, 0xb3, 0xf7, 0x85, 0x99, 0xb2, 0xd0, 0x64, 0x97,
      0xb7, 0x3c, 0x0e, 0x58, 0xdf, 0xd2, 0x98, 0x98, 0x18, 0x1a, 0xf5, 0x59,
      0xcd, 0xc5, 0x48, 0x17, 0x10, 0x9f, 0xd8, 0x19, 0xbd, 0xd0, 0x42, 0x71,
      0x1c, 0x30, 0xc6, 0x76, 0xe9, 0xb0, 0xee, 0xf5, 0x38, 0x05, 0xbe, 0x9b,
      0x6c, 0x0d, 0xb0, 0xd0, 0xda, 0x1c, 0x89, 0xbd, 0x40, 0x5d, 0xc2, 0x5a,
      0xbe, 0x83, 0xa6, 0xb5, 0x47, 0xa7, 0xf8, 0xb9, 0xbf, 0xa2, 0x65, 0x17,
      0x1e, 0xd8, 0x28, 0x42, 0xbe, 0xb0, 0x35, 0xf6, 0x7b, 0x88, 0x38, 0xbe,
      0xf5, 0xb5, 0x1b, 0x63, 0x7a, 0x83, 0x92, 0x0d, 0x64, 0xad, 0x92, 0x59,
      0x97, 0x55, 0x5c, 0x60, 0xab, 0x48, 0x8e, 0x23, 0x27, 0x22, 0x75, 0x3b,
      0x7c, 0x9c, 0x69, 0x13, 0x52, 0x6b, 0xae, 0xfd, 0x38, 0xe5, 0x4b, 0x36,
      0x78, 0x55, 0x92, 0xb5, 0x8f, 0x25, 0xde, 0x0e, 0x93, 0xe3, 0x1d, 0x83,
      0x62, 0x05, 0x6a, 0x5a, 0xff, 0x7f, 0x77, 0xf7, 0x1b, 0xfc, 0x21, 0x45,
      0xf7, 0xb8, 0xfa, 0xcb, 0x00, 0x5e, 0x85, 0xf9, 0x2f, 0x15, 0x2f, 0xcf,
      0x17, 0x9e, 0x84, 0xf6, 0xf5, 0x15, 0x6e, 0xdd, 0xb4, 0x73, 0x44, 0xc2,
      0x2c, 0x74, 0xae, 0x27, 0x5f, 0x19, 0xe7, 0x51, 0x61, 0xc1, 0x82, 0xce,
      0xf1, 0x5b, 0xa0, 0x6f, 0x0b, 0x13, 0x10, 0x68, 0xb7, 0xee, 0xfb, 0x8a,
      0x85, 0xe2, 0xd6, 0x17, 0x55, 0x26, 0xa5, 0xc5, 0xb3, 0x94, 0x45, 0xdf,
      0x49, 0xe6, 0x50, 0xf8, 0x99, 0xd8, 0x3c, 0xcb, 0x94, 0x80, 0x67, 0x3b,
      0x73, 0xac, 0xf6, 0x46, 0x31, 0x63, 0xb3, 0x1b, 0x47, 0xce, 0x40, 0x3f,
      0x8c, 0xd0, 0x82, 0xc4, 0x79, 0x3a, 0x7c, 0x48, 0x10, 0xe3, 0x97, 0x98,
      0xdc, 0x0b, 0x62, 0x42, 0xfa, 0x26, 0x05, 0xf6, 0x8c, 0x32, 0xa9, 0xb6,
      0x2c, 0x4f, 0x85, 0xd2, 0x9b, 0xf3, 0x89, 0x1f, 0x91, 0xca, 0x12, 0x3d,
      0xe2, 0xa8, 0x0b, 0xca, 0x64, 0x28, 0x0e, 0xa7, 0xfd, 0xd8, 0xa3, 0xcb,
      0x0a, 0xd9, 0x97, 0x2d, 0xc3, 0xf2, 0x39, 0x74, 0xdb, 0xe3, 0x9a, 0x87,
      0x1a, 0xe0, 0x33, 0xe3, 0x92, 0xe8, 0xde, 0xb5, 0x08, 0x28, 0xcb, 0xd7,
      0xb6, 0x79, 0xec, 0x71, 0xcc, 0xe5, 0xd1, 0x4b, 0x89, 0x96, 0x5f, 0xfa,
      0xfd, 0x4b, 0xd0, 0xa8, 0x66, 0x0d, 0xb4, 0xa7, 0x51, 0x56, 0xbc, 0xa7,
      0x74, 0x07, 0x7f, 0xae, 0x0e, 0xf6, 0x9c, 0x13, 0xd9, 0xf2, 0xed, 0x12,
      0xa9, 0x87, 0x3e, 0xb7, 0x9d, 0x53, 0x8a, 0x82, 0x2d, 0x03, 0x2f, 0xac,
      0x94, 0x84, 0x95, 0x00, 0x29, 0x09, 0x01, 0x38, 0x62, 0xff, 0xaf, 0xfd,
      0x10, 0x2b, 0x31, 0x03, 0xb2, 0x4f, 0x51, 0xfb, 0x76, 0x27, 0x1e, 0x25,
      0x82, 0x79, 0x65, 0x69, 0xfa, 0x24, 0xaf, 0xcb, 0xe8, 0x40, 0x8d, 0x7d,
      0xd2, 0x9a, 0x12, 0x69, 0x2f, 0xe4, 0xce, 0x99, 0x98, 0x4f, 0x6c, 0x46,
      0xfd, 0x63, 0x40, 0x50, 0xef, 0x22, 0x02, 0x68, 0x2e, 0x53, 0xbb, 0x00,
      0xa3, 0x65, 0x61, 0x3e, 0x97, 0xd4, 0x5f, 0xa2, 0xc1, 0x66, 0xcd, 0x04,
      0xdc, 0xda, 0x55, 0x10, 0x28, 0x0d, 0x40, 0x11, 0xe6, 0x68, 0xed, 0x68,
      0x38, 0x7d, 0x20, 0xc3, 0x97, 0x9d, 0xcb, 0x6e, 0x30, 0xfc, 0xbe, 0x63,
      0xe7, 0x72, 0x47, 0x05, 0xf5, 0x0b, 0x7e, 0x66, 0x3b, 0xc5, 0x3a, 0x85,
      0x5a, 0xa3, 0xc5, 0x72, 0x9d, 0xb9, 0xc1, 0xb4, 0x80, 0x98, 0x6e, 0x40,
      0x86, 0xc9, 0xcb, 0xa3, 0xab, 0x77, 0xc2, 0x56, 0xfc, 0xcb, 0x6e, 0x12,
      0xf5, 0x63, 0x62, 0xf8, 0xff, 0x91, 0x15, 0xa7, 0xa1, 0x5e, 0xb6, 0xee,
      0x69, 0x4d, 0x5b, 0x5f, 0x4e, 0xfa, 0xd3, 0x61, 0xca, 0xec, 0x14, 0xfd,
      0xd9, 0x10, 0xf5, 0x4a, 0x05, 0x5f, 0x29, 0xcb, 0x77, 0x2c, 0x2d, 0xe2,
      0x90, 0x67, 0x62, 0x78, 0x75, 0xa9, 0x4e, 0x20, 0x00, 0x0c, 0x91, 0x84,
      0xba, 0xed, 0x1c, 0xce, 0xbd, 0x57, 0x4f, 0xa5, 0x2f, 0x59, 0x6c, 0x4c,
      0xdf, 0x5f, 0xaa, 0x32, 0xf0, 0x86, 0x09, 0x15, 0x36, 0xc6, 0xe6, 0x6a,
      0x24, 0xb4, 0xb3, 0x09, 0xdd, 0x32, 0xc5, 0x95, 0xac, 0x60, 0xb5, 0x09,
      0x97, 0x36, 0xa1, 0x3c, 0x8f, 0x0e, 0x90, 0x8e, 0xcd, 0xd0, 0x49, 0x75,
      0xf7, 0xf3, 0x80, 0x80, 0xcb, 0x1f, 0xee, 0xf2, 0x6a, 0x2f, 0x19, 0x8c,
      0xba, 0x10, 0x00, 0xda, 0x13, 0xef, 0x10, 0x2b, 0xb7, 0xef, 0xfd, 0xd1,
      0xe0, 0x7c, 0xf8, 0x46, 0x01, 0x69, 0x9b, 0x99, 0x80, 0x51, 0x1f, 0x74,
      0x3b, 0x67, 0x93, 0x18, 0x5e, 0xd4, 0x34, 0x6c, 0x81, 0x76, 0x02, 0xef,
      0x91, 0xa4, 0x22, 0x2a, 0x23, 0x1b, 0x58, 0x43, 0x75, 0x65, 0x13, 0x87,
      0x98, 0x60, 0x14, 0x25, 0x28, 0x67, 0xa3, 0x34, 0x8c, 0xe0, 0xd5, 0xd3,
      0x51, 0x33, 0x68, 0xff, 0x65, 0x59, 0x5a, 0xa7, 0xb2, 0x6b, 0x01, 0xad,
      0x70, 0x06, 0x73, 0x01, 0x51, 0x1b, 0xe1, 0xec, 0x28, 0x2f, 0x8a, 0x85,
      0x5a, 0x10, 0xd0, 0x0e, 0x6b, 0x35, 0x45, 0x2e, 0x61, 0xdd, 0x77, 0x20,
      0xb1, 0x35, 0x3b, 0xa8, 0xdd, 0x8a, 0xe2, 0x15, 0x79, 0x07,
  };
  uint8_t pub_bytes[HRSS_PUBLIC_KEY_BYTES];
  HRSS_marshal_public_key(pub_bytes, &pub);
  EXPECT_EQ(Bytes(pub_bytes), Bytes(kExpectedPub));

  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  for (size_t i = 0; i < sizeof(encap_entropy); i++) {
    encap_entropy[i] = 31 + i;
  }
  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub, encap_entropy));

  static const uint8_t kExpectedCiphertext[HRSS_CIPHERTEXT_BYTES] = {
      0xe0, 0xc0, 0x77, 0xeb, 0x7a, 0x48, 0x7d, 0x74, 0x4e, 0x4f, 0x6d, 0xb9,
      0x5c, 0x18, 0xe9, 0x5b, 0x47, 0x6c, 0x78, 0x9d, 0x98, 0x02, 0x84, 0x9f,
      0xf2, 0x45, 0x43, 0x86, 0x0e, 0xc6, 0x93, 0x48, 0xd8, 0x20, 0xff, 0x82,
      0x38, 0x9e, 0x78, 0xb4, 0x2c, 0xb3, 0x42, 0xe4, 0xb3, 0xab, 0xdf, 0xed,
      0x65, 0x24, 0x0c, 0xa5, 0x95, 0x2c, 0xbf, 0x4c, 0x28, 0xfc, 0xb8, 0xe7,
      0xc6, 0xbc, 0x76, 0xa0, 0xf5, 0x3f, 0x29, 0x73, 0x23, 0xf1, 0x6c, 0x10,
      0x7c, 0x08, 0x8e, 0x16, 0x3a, 0xda, 0x17, 0xa3, 0x0d, 0x46, 0x44, 0xee,
      0x6f, 0x70, 0xf1, 0x88, 0x51, 0x35, 0x33, 0x91, 0x76, 0xeb, 0x98, 0xc1,
      0x04, 0xdb, 0x97, 0xab, 0x88, 0xb9, 0x04, 0x87, 0xd9, 0xb8, 0x34, 0xd3,
      0x38, 0xe7, 0x90, 0x05, 0x2e, 0x45, 0xe0, 0xac, 0x36, 0x0c, 0x59, 0x58,
      0xb1, 0xf5, 0x65, 0x6d, 0x28, 0x1a, 0x39, 0xd9, 0xd2, 0x83, 0x17, 0xee,
      0xeb, 0x6f, 0x7d, 0x29, 0x3c, 0x79, 0xcf, 0x48, 0xf1, 0x6d, 0x35, 0xc2,
      0x8c, 0xe8, 0x67, 0x18, 0xcc, 0x9d, 0x9b, 0x8d, 0x07, 0x7a, 0x4e, 0x56,
      0xa8, 0x00, 0x2e, 0x67, 0x67, 0xbb, 0xc1, 0xda, 0x4a, 0x7b, 0x9f, 0xa6,
      0x4a, 0x5c, 0x40, 0xcc, 0xe4, 0xdd, 0xf5, 0xc0, 0x44, 0xfe, 0xa5, 0xa2,
      0x1c, 0xdc, 0xf2, 0x31, 0xf4, 0x01, 0x1f, 0x69, 0x15, 0x7e, 0x8c, 0x54,
      0xb6, 0x47, 0x0c, 0x1d, 0x9f, 0x1a, 0xfa, 0xf7, 0x46, 0xa3, 0xcb, 0x34,
      0x2c, 0x18, 0x45, 0x65, 0xc4, 0xf2, 0x0e, 0xf8, 0xc7, 0x96, 0x1d, 0x29,
      0x5c, 0x90, 0xd3, 0xdf, 0xb2, 0x8e, 0x21, 0xf9, 0x15, 0x40, 0x7e, 0xd3,
      0x84, 0x52, 0x1d, 0xd9, 0xee, 0xed, 0xe8, 0x71, 0x1c, 0xdb, 0x48, 0xf5,
      0x20, 0x82, 0xc4, 0x61, 0xfd, 0x6d, 0x71, 0x9f, 0xd8, 0x03, 0x90, 0x8e,
      0xfc, 0xed, 0x4d, 0xab, 0x6e, 0xb2, 0xe9, 0x66, 0xfd, 0xcc, 0x3a, 0xa3,
      0x99, 0x53, 0x35, 0x76, 0xea, 0x08, 0x88, 0xba, 0xf0, 0xb7, 0x53, 0xf3,
      0x4c, 0x1a, 0x8f, 0x7f, 0xe4, 0x1b, 0x8b, 0xfc, 0x99, 0x3e, 0x4c, 0xa9,
      0xd9, 0x17, 0x10, 0x64, 0x60, 0xfd, 0x81, 0x76, 0xe6, 0x37, 0xb0, 0xe3,
      0x3e, 0xc0, 0xf7, 0x06, 0x7e, 0x34, 0xa5, 0xf4, 0xb9, 0x5f, 0x66, 0xe6,
      0x81, 0xc8, 0x5e, 0xb2, 0x26, 0x6b, 0x8c, 0xad, 0xd0, 0x94, 0x01, 0x22,
      0xf6, 0xbe, 0x1a, 0x0b, 0x34, 0xfc, 0x33, 0xc0, 0x84, 0xa5, 0xe0, 0x12,
      0x8a, 0x08, 0xae, 0x8a, 0xaf, 0x55, 0x0c, 0x34, 0x4b, 0x2b, 0xdd, 0xa3,
      0x7c, 0xc0, 0xed, 0xe8, 0x8d, 0x98, 0x47, 0x7c, 0x81, 0x25, 0x1b, 0x9f,
      0x08, 0x26, 0x9d, 0xfc, 0x19, 0x8e, 0x39, 0xc4, 0x1a, 0x3c, 0x42, 0x70,
      0x49, 0x37, 0x57, 0x87, 0x0f, 0x76, 0xb1, 0xc4, 0xbe, 0x25, 0x5e, 0x1c,
      0x06, 0x57, 0xc6, 0x88, 0x34, 0x28, 0xdf, 0x60, 0x33, 0x09, 0xc5, 0xcc,
      0xf4, 0xc4, 0x33, 0x85, 0x8b, 0x48, 0xe8, 0x27, 0xb7, 0x72, 0x22, 0x44,
      0xff, 0xe7, 0x89, 0xf9, 0x71, 0x99, 0xed, 0x62, 0x47, 0xb0, 0x22, 0x9e,
      0xa6, 0x7c, 0xaf, 0xa9, 0x98, 0x2b, 0x5c, 0x8a, 0x42, 0x34, 0x77, 0xa3,
      0xc8, 0x13, 0x1e, 0xcf, 0x32, 0xa7, 0x70, 0xa8, 0xad, 0xc1, 0x66, 0x5c,
      0x8f, 0xaf, 0x14, 0x6d, 0xc4, 0x45, 0x05, 0xcd, 0xcb, 0x80, 0xfa, 0x0e,
      0xa6, 0xca, 0x72, 0x86, 0xd2, 0xb7, 0x39, 0x26, 0x77, 0xf8, 0x14, 0xd0,
      0xcd, 0xdd, 0xf7, 0xdc, 0xda, 0x25, 0x8e, 0x3c, 0x21, 0xfd, 0xef, 0x92,
      0xee, 0x52, 0xf7, 0xc3, 0xc7, 0xe2, 0x2d, 0x1c, 0x57, 0x5a, 0xba, 0xd8,
      0xaa, 0x0d, 0x09, 0xa7, 0xb3, 0xcc, 0xa1, 0x5d, 0xdb, 0x04, 0x21, 0x82,
      0xef, 0xba, 0xc2, 0xc8, 0x54, 0xb1, 0xbe, 0xd7, 0x2a, 0x91, 0xd8, 0xeb,
      0x72, 0x54, 0xc1, 0x74, 0x24, 0x24, 0x5a, 0x03, 0xf7, 0xcd, 0xab, 0x91,
      0xd1, 0x63, 0xf1, 0x60, 0x9f, 0x22, 0x07, 0xad, 0x10, 0x2b, 0x97, 0x1c,
      0x6f, 0xce, 0xc0, 0x29, 0xc2, 0xb2, 0xb8, 0x1b, 0xbd, 0x14, 0xc8, 0xb9,
      0x80, 0x66, 0xc1, 0x86, 0xfc, 0x93, 0x5f, 0x6e, 0x0b, 0x7a, 0x7b, 0x8e,
      0x42, 0x8c, 0x08, 0xd1, 0x60, 0xb9, 0xf8, 0x66, 0x24, 0x7d, 0x88, 0x58,
      0x2f, 0xd2, 0x52, 0x75, 0x3a, 0x8a, 0x1c, 0xfa, 0x1e, 0xa1, 0x1c, 0x91,
      0x46, 0x79, 0x9a, 0xe5, 0x8a, 0xdd, 0xc2, 0x75, 0xed, 0x0d, 0xb8, 0x2b,
      0x4f, 0x8f, 0x95, 0xca, 0xce, 0x21, 0xa4, 0x7a, 0x0d, 0x14, 0x7f, 0x2d,
      0x98, 0xf0, 0x88, 0xc3, 0x6f, 0xad, 0xb5, 0x04, 0x24, 0x91, 0x41, 0x65,
      0xd3, 0xa5, 0x7e, 0xfb, 0x53, 0x1c, 0xcc, 0xd0, 0xf7, 0x7c, 0x91, 0x08,
      0x0e, 0xdd, 0xd4, 0x6c, 0x73, 0xaa, 0xa5, 0x7a, 0xd2, 0x24, 0xc9, 0x3b,
      0x6f, 0xda, 0x06, 0x8a, 0xdb, 0x2e, 0xa8, 0xe9, 0xe1, 0x3e, 0x08, 0xee,
      0xbe, 0x96, 0x65, 0x72, 0x68, 0x6f, 0xf7, 0x50, 0xe7, 0xa7, 0x18, 0xda,
      0xc2, 0x94, 0xda, 0xe3, 0xbc, 0xca, 0x03, 0xd8, 0xf7, 0x7a, 0xcc, 0x44,
      0xa1, 0x60, 0xa8, 0x7f, 0xdc, 0xef, 0x80, 0xf4, 0x62, 0xc6, 0x06, 0x4e,
      0xb6, 0xac, 0x77, 0x17, 0xb7, 0xb3, 0x3e, 0xf8, 0x6d, 0x8a, 0x61, 0x83,
      0x3a, 0xfd, 0xbb, 0x93, 0x5b, 0x1a, 0x33, 0xf8, 0xee, 0x7d, 0x9e, 0x5c,
      0xf8, 0xc9, 0xd5, 0x3e, 0x3d, 0x42, 0x9b, 0xe5, 0x0d, 0xec, 0xc9, 0x0f,
      0x6f, 0x03, 0xb0, 0x41, 0x85, 0xb9, 0xfe, 0xf9, 0xb1, 0xb4, 0xc3, 0xd9,
      0x13, 0x03, 0xfa, 0x0d, 0xe7, 0xd1, 0xb4, 0xc8, 0xf6, 0xb5, 0x11, 0x7a,
      0x92, 0x09, 0x21, 0x7b, 0xa9, 0x89, 0x4c, 0x19, 0x90, 0x0d, 0x96, 0x32,
      0x4f, 0x77, 0xfc, 0x7f, 0x8c, 0xa3, 0x39, 0x2a, 0x56, 0xe6, 0x5c, 0xd1,
      0x86, 0x0a, 0x72, 0xf4, 0xa3, 0x1b, 0xa5, 0x30, 0x04, 0x3c, 0x15, 0x20,
      0x4b, 0xe4, 0x2d, 0x1a, 0xf1, 0x44, 0x48, 0xfc, 0xda, 0xc1, 0x41, 0xdb,
      0x71, 0xfd, 0x92, 0x00, 0x53, 0xe4, 0x70, 0xd0, 0xba, 0xf6, 0xef, 0x17,
      0x72, 0xb8, 0xea, 0x6d, 0x41, 0x16, 0x4d, 0x1f, 0x59, 0x18, 0xbd, 0x1f,
      0xc5, 0x6b, 0x6a, 0x6c, 0x2e, 0xa6, 0x1a, 0x33, 0x74, 0x8b, 0xc5, 0x9f,
      0x16, 0x01, 0x77, 0x7e, 0x37, 0xe7, 0x63, 0xe1, 0xa3, 0x8c, 0x1f, 0x71,
      0xe9, 0x4f, 0xad, 0x15, 0x8b, 0xf3, 0xc9, 0xac, 0xdc, 0x19, 0xad, 0x92,
      0x18, 0x00, 0xf6, 0xa1, 0xd5, 0x97, 0xa3, 0x3d, 0x9e, 0x78, 0x02, 0xc3,
      0x8f, 0x75, 0xd8, 0xad, 0x22, 0xbf, 0xef, 0x19, 0x5d, 0x15, 0x34, 0x1a,
      0x7c, 0x9b, 0xaf, 0xd4, 0xf2, 0xf9, 0x5f, 0x72, 0x88, 0x9c, 0xe4, 0x58,
      0xda, 0x46, 0x8f, 0x79, 0x30, 0x2b, 0xd9, 0x3b, 0xbc, 0xab, 0x28, 0x77,
      0x75, 0x0e, 0x2c, 0x23, 0x47, 0x95, 0x14, 0xeb, 0xf0, 0x4a, 0x3e, 0x53,
      0x93, 0xa7, 0xf4, 0x82, 0x9c, 0x34, 0x8b, 0x80, 0x42, 0xb2, 0xa7, 0xb0,
      0x7c, 0x6c, 0xe1, 0x07, 0xf4, 0x34, 0x3e, 0xed, 0x33, 0x9c, 0xb3, 0xde,
      0xa5, 0x91, 0x61, 0x25, 0x8e, 0x8c, 0x54, 0x56, 0xbe, 0x1a, 0xac, 0x17,
      0xd2, 0x7a, 0xa4, 0x12, 0x54, 0x2a, 0x51, 0xd0, 0x0e, 0xd1, 0xc1, 0x44,
      0x50, 0x05, 0x39, 0xa7, 0xb6, 0x14, 0x45, 0xca, 0xf8, 0x5f, 0x06, 0x6b,
      0x5d, 0x5e, 0xc7, 0xe9, 0x27, 0x6f, 0x38, 0xe0, 0x31, 0xcf, 0xf8, 0xcc,
      0x2e, 0xb9, 0x4a, 0x10, 0x1b, 0xb4, 0x34, 0x4b, 0x90, 0xbb, 0xf2, 0xe0,
      0x3c, 0x79, 0x7f, 0x39, 0x59, 0x0c, 0x01, 0x4c, 0x0d, 0x2d, 0x71, 0xf1,
      0xbd, 0xda, 0x1a, 0x78, 0xcf, 0x26, 0x6f, 0xb5, 0xa9, 0x07, 0x20, 0xe6,
      0x8c, 0xd0, 0xad, 0xd4, 0xca, 0x24, 0x6c, 0xc5, 0x28, 0x1d, 0xfb, 0xcc,
      0xe7, 0x93, 0x72, 0x99, 0x61, 0x63, 0x60, 0x4c, 0x5c, 0xa9, 0xb6, 0x15,
      0x32, 0xa4, 0xbc, 0x1f, 0xf6, 0x63, 0x61, 0x2c, 0x26, 0xa7, 0x0e, 0x5f,
      0x1b, 0x25, 0xce, 0x3f, 0x64, 0xdf, 0x6d, 0xb0, 0x8f, 0xd2, 0xe9, 0x3b,
      0x35, 0xd0, 0x59, 0x81, 0x22, 0xf1, 0x65, 0x86, 0x15, 0x10, 0xe8, 0xa7,
      0xa1, 0x6f, 0xb4, 0x34, 0x1c, 0x79, 0xd5, 0x9e, 0x8d, 0xc8, 0xa5, 0xbb,
      0x82, 0x71, 0x81, 0x00, 0x34, 0x55, 0x6b, 0x96, 0x56, 0x13, 0x0e, 0xe7,
      0x39, 0xa2, 0x6f, 0xbe, 0x54, 0x2a, 0x13, 0x03, 0x13, 0xd2, 0x1d, 0x71,
      0x9a, 0xbe, 0x09, 0x00, 0xe1, 0x8d, 0x59, 0xb5, 0x44, 0x02,
  };
  EXPECT_EQ(Bytes(ciphertext), Bytes(kExpectedCiphertext));

  static const uint8_t kExpectedSharedKey[HRSS_KEY_BYTES] = {
      0x57, 0xf2, 0x77, 0xb2, 0xf3, 0x7f, 0xd0, 0x71, 0xb6, 0x7e, 0x64,
      0x0f, 0x85, 0x1f, 0x6d, 0x3b, 0xd1, 0x7a, 0x6e, 0x01, 0x04, 0xde,
      0x0f, 0x9e, 0x03, 0x95, 0x55, 0x60, 0xce, 0xda, 0x32, 0x71,
  };
  EXPECT_EQ(Bytes(shared_key), Bytes(kExpectedSharedKey));

  ASSERT_TRUE(HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext)));
  EXPECT_EQ(Bytes(shared_key, sizeof(shared_key)),
            Bytes(kExpectedSharedKey, sizeof(kExpectedSharedKey)));

  // Corrupt the ciphertext and ensure that the failure key is constant.
  ciphertext[50] ^= 4;
  ASSERT_TRUE(HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext)));

  static const uint8_t kExpectedFailureKey[HRSS_KEY_BYTES] = {
      0x13, 0xf7, 0xed, 0x51, 0x00, 0xbc, 0xca, 0x29, 0xdf, 0xb0, 0xd0,
      0x5e, 0xa1, 0x9d, 0x15, 0xb2, 0xf6, 0x23, 0x94, 0xfd, 0x93, 0x74,
      0x14, 0x46, 0x85, 0x61, 0x8b, 0x87, 0x30, 0xd3, 0x8d, 0xad,
  };
  EXPECT_EQ(Bytes(shared_key), Bytes(kExpectedFailureKey));
}